

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

vector<json11::Json,_std::allocator<json11::Json>_> *
json11::Json::parse_multi
          (vector<json11::Json,_std::allocator<json11::Json>_> *__return_storage_ptr__,string *in,
          size_type *parser_stop_pos,string *err,JsonParse strategy)

{
  JsonParser parser;
  JsonParser local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_58.i = 0;
  local_58.failed = false;
  *parser_stop_pos = 0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (in->_M_string_length != 0) {
    local_58.str = in;
    local_58.err = err;
    local_58.strategy = strategy;
    while( true ) {
      anon_unknown_22::JsonParser::parse_json((JsonParser *)&stack0xffffffffffffffc8,(int)&local_58)
      ;
      std::vector<json11::Json,_std::allocator<json11::Json>_>::emplace_back<json11::Json>
                (__return_storage_ptr__,(Json *)&stack0xffffffffffffffc8);
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
      if (local_58.failed != false) break;
      anon_unknown_22::JsonParser::consume_garbage(&local_58);
      if (local_58.failed != false) {
        return __return_storage_ptr__;
      }
      *parser_stop_pos = local_58.i;
      if (local_58.i == in->_M_string_length) {
        return __return_storage_ptr__;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Json> Json::parse_multi(const string &in,
                               std::string::size_type &parser_stop_pos,
                               string &err,
                               JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    parser_stop_pos = 0;
    vector<Json> json_vec;
    while (parser.i != in.size() && !parser.failed) {
        json_vec.push_back(parser.parse_json(0));
        if (parser.failed)
            break;

        // Check for another object
        parser.consume_garbage();
        if (parser.failed)
            break;
        parser_stop_pos = parser.i;
    }
    return json_vec;
}